

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void nn_append_string_to_free(nn_parse_context *ctx,nn_option *opt,char *str)

{
  long *plVar1;
  void *pvVar2;
  nn_string_list *lst;
  char *str_local;
  nn_option *opt_local;
  nn_parse_context *ctx_local;
  
  plVar1 = (long *)((long)ctx->target + (long)opt->offset);
  if (plVar1[1] == 0) {
    pvVar2 = malloc(8);
    plVar1[1] = (long)pvVar2;
    *(undefined4 *)((long)plVar1 + 0x14) = 1;
  }
  else {
    *(int *)((long)plVar1 + 0x14) = *(int *)((long)plVar1 + 0x14) + 1;
    pvVar2 = realloc((void *)*plVar1,(long)*(int *)((long)plVar1 + 0x14) << 3);
    plVar1[1] = (long)pvVar2;
  }
  if (*plVar1 == 0) {
    nn_memory_error(ctx);
  }
  *(char **)(plVar1[1] + (long)(*(int *)((long)plVar1 + 0x14) + -1) * 8) = str;
  return;
}

Assistant:

static void nn_append_string_to_free (struct nn_parse_context *ctx,
                                      struct nn_option *opt, char *str)
{
    struct nn_string_list *lst;

    lst = (struct nn_string_list *)(
        ((char *)ctx->target) + opt->offset);
    if (lst->to_free) {
        lst->to_free_num += 1;
        lst->to_free = realloc (lst->items,
                                sizeof (char *) * lst->to_free_num);
    } else {
        lst->to_free = malloc (sizeof (char *));
        lst->to_free_num = 1;
    }
    if (!lst->items) {
        nn_memory_error (ctx);
    }
    lst->to_free[lst->to_free_num-1] = str;
}